

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

DOMElement * __thiscall
xercesc_4_0::TraverseSchema::checkIdentityConstraintContent
          (TraverseSchema *this,DOMElement *content)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TraverseSchema *this_00;
  
  if (content != (DOMElement *)0x0) {
    do {
      this_00 = (TraverseSchema *)content;
      iVar2 = (*(*(_func_int ***)content)[0x18])();
      bVar1 = isIdentityConstraintName(this_00,(XMLCh *)CONCAT44(extraout_var,iVar2));
      if (!bVar1) {
        return (DOMElement *)(TraverseSchema *)content;
      }
      content = XUtil::getNextSiblingElement(&content->super_DOMNode);
    } while ((TraverseSchema *)content != (TraverseSchema *)0x0);
  }
  return (DOMElement *)0x0;
}

Assistant:

const DOMElement*
TraverseSchema::checkIdentityConstraintContent(const DOMElement* const content) {

    const DOMElement* child = content;

    if (child != 0) {

        do {

            if (!isIdentityConstraintName(child->getLocalName())) {
                break;
            }

            child = XUtil::getNextSiblingElement(child);

        } while (child != 0);
    }

    return child;
}